

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::BatchedMatMulLayerParams::SerializeWithCachedSizes
          (BatchedMatMulLayerParams *this,CodedOutputStream *output)

{
  if (this->transposea_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(1,true,output);
  }
  if (this->transposeb_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(2,true,output);
  }
  if (this->weightmatrixfirstdimension_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64
              (5,this->weightmatrixfirstdimension_,output);
  }
  if (this->weightmatrixseconddimension_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64
              (6,this->weightmatrixseconddimension_,output);
  }
  if (this->hasbias_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(7,true,output);
  }
  if (this->weights_ != (WeightParams *)0x0 &&
      this != (BatchedMatMulLayerParams *)&_BatchedMatMulLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (8,&this->weights_->super_MessageLite,output);
  }
  if (this->bias_ != (WeightParams *)0x0 &&
      this != (BatchedMatMulLayerParams *)&_BatchedMatMulLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (9,&this->bias_->super_MessageLite,output);
  }
  if (this->int8dynamicquantize_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(10,true,output);
    return;
  }
  return;
}

Assistant:

void BatchedMatMulLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.BatchedMatMulLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // bool transposeA = 1;
  if (this->transposea() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(1, this->transposea(), output);
  }

  // bool transposeB = 2;
  if (this->transposeb() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(2, this->transposeb(), output);
  }

  // uint64 weightMatrixFirstDimension = 5;
  if (this->weightmatrixfirstdimension() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(5, this->weightmatrixfirstdimension(), output);
  }

  // uint64 weightMatrixSecondDimension = 6;
  if (this->weightmatrixseconddimension() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(6, this->weightmatrixseconddimension(), output);
  }

  // bool hasBias = 7;
  if (this->hasbias() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(7, this->hasbias(), output);
  }

  // .CoreML.Specification.WeightParams weights = 8;
  if (this->has_weights()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      8, *this->weights_, output);
  }

  // .CoreML.Specification.WeightParams bias = 9;
  if (this->has_bias()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      9, *this->bias_, output);
  }

  // bool int8DynamicQuantize = 10;
  if (this->int8dynamicquantize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(10, this->int8dynamicquantize(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.BatchedMatMulLayerParams)
}